

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  cmCryptoHash *this_00;
  cmStateSnapshot *__return_storage_ptr__;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 *puVar6;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *pvVar7;
  const_reference ppcVar8;
  cmState *this_01;
  char *pcVar9;
  const_reference remote_path;
  mapped_type *pmVar10;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [8];
  string fname;
  undefined1 local_a8 [8];
  cmOutputConverter converter;
  undefined1 local_78 [8];
  string md5_hex;
  cmCryptoHash md5;
  RuleHash hash;
  string *content_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmGlobalGenerator *this_local;
  
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(outputs);
  if (!bVar5) {
    this_00 = (cmCryptoHash *)((long)&md5_hex.field_2 + 8);
    cmCryptoHash::cmCryptoHash(this_00,AlgoMD5);
    cmCryptoHash::HashString((string *)local_78,this_00,content);
    puVar6 = (undefined8 *)std::__cxx11::string::c_str();
    uVar1 = *puVar6;
    uVar2 = puVar6[1];
    uVar3 = puVar6[2];
    uVar4 = puVar6[3];
    std::__cxx11::string::~string((string *)local_78);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)((long)&md5_hex.field_2 + 8));
    pvVar7 = GetMakefiles(this);
    ppcVar8 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](pvVar7,0);
    __return_storage_ptr__ = (cmStateSnapshot *)((long)&fname.field_2 + 8);
    cmMakefile::GetStateSnapshot(__return_storage_ptr__,*ppcVar8);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_a8,__return_storage_ptr__);
    pvVar7 = GetMakefiles(this);
    ppcVar8 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](pvVar7,0);
    this_01 = cmMakefile::GetState(*ppcVar8);
    pcVar9 = cmState::GetBinaryDirectory(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,pcVar9,&local_101);
    remote_path = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](outputs,0);
    cmOutputConverter::ConvertToRelativePath
              ((string *)local_e0,(cmOutputConverter *)local_a8,&local_100,remote_path);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
              ::operator[](&this->RuleHashes,(key_type *)local_e0);
    *(undefined8 *)pmVar10->Data = uVar1;
    *(undefined8 *)(pmVar10->Data + 8) = uVar2;
    *(undefined8 *)(pmVar10->Data + 0x10) = uVar3;
    *(undefined8 *)(pmVar10->Data + 0x18) = uVar4;
    std::__cxx11::string::~string((string *)local_e0);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddRuleHash(const std::vector<std::string>& outputs,
                                    std::string const& content)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Ignore if there are no outputs.
  if (outputs.empty()) {
    return;
  }

  // Compute a hash of the rule.
  RuleHash hash;
  {
    cmCryptoHash md5(cmCryptoHash::AlgoMD5);
    std::string const md5_hex = md5.HashString(content);
    memcpy(hash.Data, md5_hex.c_str(), 32);
  }

  // Shorten the output name (in expected use case).
  cmOutputConverter converter(this->GetMakefiles()[0]->GetStateSnapshot());
  std::string fname = converter.ConvertToRelativePath(
    this->GetMakefiles()[0]->GetState()->GetBinaryDirectory(), outputs[0]);

  // Associate the hash with this output.
  this->RuleHashes[fname] = hash;
#else
  (void)outputs;
  (void)content;
#endif
}